

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int cvSensRhs1InternalDQ
              (int Ns,sunrealtype t,N_Vector y,N_Vector ydot,int is,N_Vector yS,N_Vector ySdot,
              void *cvode_mem,N_Vector ytemp,N_Vector ftemp)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  long in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  N_Vector Xvecs [3];
  sunrealtype cvals [3];
  sunrealtype ratio;
  sunrealtype norms;
  sunrealtype r2Delta;
  sunrealtype rDelta;
  sunrealtype Delta;
  sunrealtype r2Deltay;
  sunrealtype rDeltay;
  sunrealtype Deltay;
  sunrealtype r2Deltap;
  sunrealtype rDeltap;
  sunrealtype Deltap;
  sunrealtype rdelta;
  sunrealtype delta;
  sunrealtype pbari;
  sunrealtype psave;
  int which;
  int nfel;
  int method;
  int retval;
  CVodeMem cv_mem;
  double local_148;
  double local_140;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  undefined8 local_108 [2];
  undefined8 local_f8;
  undefined8 local_e8;
  double local_e0;
  double local_d8;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  int local_50;
  int local_4c;
  undefined4 local_48;
  int local_44;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_4c = 0;
  local_40 = in_stack_00000008;
  if (*(double *)(in_stack_00000008 + 0x28) < *(double *)(in_stack_00000008 + 8) ||
      *(double *)(in_stack_00000008 + 0x28) == *(double *)(in_stack_00000008 + 8)) {
    local_110 = *(double *)(in_stack_00000008 + 8);
  }
  else {
    local_110 = *(double *)(in_stack_00000008 + 0x28);
  }
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  if (0.0 < local_110) {
    if (*(double *)(in_stack_00000008 + 0x28) < *(double *)(in_stack_00000008 + 8) ||
        *(double *)(in_stack_00000008 + 0x28) == *(double *)(in_stack_00000008 + 8)) {
      local_120 = *(double *)(in_stack_00000008 + 8);
    }
    else {
      local_120 = *(double *)(in_stack_00000008 + 0x28);
    }
    local_118 = sqrt(local_120);
  }
  else {
    local_118 = 0.0;
  }
  local_68 = local_118;
  local_70 = 1.0 / local_118;
  local_60 = *(double *)(*(long *)(local_40 + 0xc0) + (long)local_24 * 8);
  local_50 = *(int *)(*(long *)(local_40 + 200) + (long)local_24 * 4);
  local_58 = *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8);
  local_78 = local_60 * local_118;
  local_80 = 1.0 / local_78;
  local_c0 = (double)N_VWrmsNorm(local_30,*(undefined8 *)(local_40 + 0x1b8));
  local_c0 = local_c0 * local_60;
  local_128 = local_c0;
  if (local_c0 <= local_70) {
    local_128 = local_70;
  }
  local_98 = local_128 / local_60;
  local_90 = 1.0 / local_98;
  if ((*(double *)(local_40 + 0xd8) != 0.0) || (NAN(*(double *)(local_40 + 0xd8)))) {
    local_c8 = local_90 * local_80;
    local_130 = local_c8;
    if (local_c8 < 1.0 / local_c8) {
      local_130 = 1.0 / local_c8;
    }
    if (*(double *)(local_40 + 0xd8) < local_130) {
      local_48 = 4;
      if (*(int *)(local_40 + 0xd0) == 1) {
        local_48 = 2;
      }
    }
    else {
      local_48 = 3;
      if (*(int *)(local_40 + 0xd0) == 1) {
        local_48 = 1;
      }
    }
  }
  else {
    local_48 = 3;
    if (*(int *)(local_40 + 0xd0) == 1) {
      local_48 = 1;
    }
  }
  switch(local_48) {
  case 1:
    local_140 = local_90;
    if (local_78 <= local_90) {
      local_140 = local_78;
    }
    local_a8 = local_140;
    local_b8 = 0.5 / local_140;
    N_VLinearSum(0x3ff0000000000000,local_140,local_18,local_30,in_stack_00000010);
    *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8) = local_58 + local_a8;
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,in_stack_00000010,local_38,*(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    N_VLinearSum(0x3ff0000000000000,-local_a8,local_18,local_30,in_stack_00000010);
    *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8) = local_58 - local_a8;
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,in_stack_00000010,in_stack_00000018,
                          *(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    N_VLinearSum(local_b8,-local_b8,local_38,in_stack_00000018,local_38);
    break;
  case 2:
    local_88 = 0.5 / local_78;
    local_a0 = 0.5 / local_90;
    N_VLinearSum(0x3ff0000000000000,local_90,local_18,local_30,in_stack_00000010);
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,in_stack_00000010,local_38,*(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    N_VLinearSum(0x3ff0000000000000,-local_90,local_18,local_30,in_stack_00000010);
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,in_stack_00000010,in_stack_00000018,
                          *(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    N_VLinearSum(local_a0,-local_a0,local_38,in_stack_00000018,local_38);
    *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8) = local_58 + local_78;
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,local_18,in_stack_00000010,*(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8) = local_58 - local_78;
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,local_18,in_stack_00000018,*(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    local_e8 = 0x3ff0000000000000;
    local_108[0] = local_38;
    local_e0 = local_88;
    local_d8 = -local_88;
    local_f8 = in_stack_00000018;
    iVar1 = N_VLinearCombination(3,&local_e8,local_108,local_38);
    if (iVar1 != 0) {
      return -0x1c;
    }
    break;
  case 3:
    local_148 = local_90;
    if (local_78 <= local_90) {
      local_148 = local_78;
    }
    local_a8 = local_148;
    local_b0 = 1.0 / local_148;
    N_VLinearSum(0x3ff0000000000000,local_148,local_18,local_30,in_stack_00000010);
    *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8) = local_58 + local_a8;
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,in_stack_00000010,local_38,*(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    N_VLinearSum(local_b0,-local_b0,local_38,local_20,local_38);
    break;
  case 4:
    N_VLinearSum(0x3ff0000000000000,local_90,local_18,local_30,in_stack_00000010);
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,in_stack_00000010,local_38,*(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    N_VLinearSum(local_98,-local_98,local_38,local_20,local_38);
    *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8) = local_58 + local_78;
    local_44 = (**(code **)(local_40 + 0x10))
                         (local_10,local_18,in_stack_00000010,*(undefined8 *)(local_40 + 0x18));
    local_4c = local_4c + 1;
    if (local_44 != 0) {
      return local_44;
    }
    local_e8 = 0x3ff0000000000000;
    local_108[0] = local_38;
    local_e0 = local_80;
    local_d8 = -local_80;
    local_f8 = local_20;
    iVar1 = N_VLinearCombination(3,&local_e8,local_108,local_38);
    if (iVar1 != 0) {
      return -0x1c;
    }
  }
  *(double *)(*(long *)(local_40 + 0xb8) + (long)local_50 * 8) = local_58;
  *(long *)(local_40 + 0x648) = (long)local_4c + *(long *)(local_40 + 0x648);
  return 0;
}

Assistant:

int cvSensRhs1InternalDQ(SUNDIALS_MAYBE_UNUSED int Ns, sunrealtype t, N_Vector y,
                         N_Vector ydot, int is, N_Vector yS, N_Vector ySdot,
                         void* cvode_mem, N_Vector ytemp, N_Vector ftemp)
{
  CVodeMem cv_mem;
  int retval, method;
  int nfel = 0, which;
  sunrealtype psave, pbari;
  sunrealtype delta, rdelta;
  sunrealtype Deltap, rDeltap, r2Deltap;
  sunrealtype Deltay, rDeltay, r2Deltay;
  sunrealtype Delta, rDelta, r2Delta;
  sunrealtype norms, ratio;

  /* local variables for fused vector operations */
  sunrealtype cvals[3];
  N_Vector Xvecs[3];

  /* cvode_mem is passed here as user data */
  cv_mem = (CVodeMem)cvode_mem;

  delta  = SUNRsqrt(SUNMAX(cv_mem->cv_reltol, cv_mem->cv_uround));
  rdelta = ONE / delta;

  pbari = cv_mem->cv_pbar[is];

  which = cv_mem->cv_plist[is];

  psave = cv_mem->cv_p[which];

  Deltap  = pbari * delta;
  rDeltap = ONE / Deltap;
  norms   = N_VWrmsNorm(yS, cv_mem->cv_ewt) * pbari;
  rDeltay = SUNMAX(norms, rdelta) / pbari;
  Deltay  = ONE / rDeltay;

  if (cv_mem->cv_DQrhomax == ZERO)
  {
    /* No switching */
    method = (cv_mem->cv_DQtype == CV_CENTERED) ? CENTERED1 : FORWARD1;
  }
  else
  {
    /* switch between simultaneous/separate DQ */
    ratio = Deltay * rDeltap;
    if (SUNMAX(ONE / ratio, ratio) <= cv_mem->cv_DQrhomax)
    {
      method = (cv_mem->cv_DQtype == CV_CENTERED) ? CENTERED1 : FORWARD1;
    }
    else { method = (cv_mem->cv_DQtype == CV_CENTERED) ? CENTERED2 : FORWARD2; }
  }

  switch (method)
  {
  case CENTERED1:

    Delta   = SUNMIN(Deltay, Deltap);
    r2Delta = HALF / Delta;

    N_VLinearSum(ONE, y, Delta, yS, ytemp);
    cv_mem->cv_p[which] = psave + Delta;

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(ONE, y, -Delta, yS, ytemp);
    cv_mem->cv_p[which] = psave - Delta;

    retval = cv_mem->cv_f(t, ytemp, ftemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(r2Delta, ySdot, -r2Delta, ftemp, ySdot);

    break;

  case CENTERED2:

    r2Deltap = HALF / Deltap;
    r2Deltay = HALF / Deltay;

    N_VLinearSum(ONE, y, Deltay, yS, ytemp);

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(ONE, y, -Deltay, yS, ytemp);

    retval = cv_mem->cv_f(t, ytemp, ftemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(r2Deltay, ySdot, -r2Deltay, ftemp, ySdot);

    cv_mem->cv_p[which] = psave + Deltap;
    retval              = cv_mem->cv_f(t, y, ytemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    cv_mem->cv_p[which] = psave - Deltap;
    retval              = cv_mem->cv_f(t, y, ftemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    /* ySdot = ySdot + r2Deltap * ytemp - r2Deltap * ftemp */
    cvals[0] = ONE;
    Xvecs[0] = ySdot;
    cvals[1] = r2Deltap;
    Xvecs[1] = ytemp;
    cvals[2] = -r2Deltap;
    Xvecs[2] = ftemp;

    retval = N_VLinearCombination(3, cvals, Xvecs, ySdot);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    break;

  case FORWARD1:

    Delta  = SUNMIN(Deltay, Deltap);
    rDelta = ONE / Delta;

    N_VLinearSum(ONE, y, Delta, yS, ytemp);
    cv_mem->cv_p[which] = psave + Delta;

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(rDelta, ySdot, -rDelta, ydot, ySdot);

    break;

  case FORWARD2:

    N_VLinearSum(ONE, y, Deltay, yS, ytemp);

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(rDeltay, ySdot, -rDeltay, ydot, ySdot);

    cv_mem->cv_p[which] = psave + Deltap;
    retval              = cv_mem->cv_f(t, y, ytemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    /* ySdot = ySdot + rDeltap * ytemp - rDeltap * ydot */
    cvals[0] = ONE;
    Xvecs[0] = ySdot;
    cvals[1] = rDeltap;
    Xvecs[1] = ytemp;
    cvals[2] = -rDeltap;
    Xvecs[2] = ydot;

    retval = N_VLinearCombination(3, cvals, Xvecs, ySdot);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    break;
  }

  cv_mem->cv_p[which] = psave;

  /* Increment counter nfeS */
  cv_mem->cv_nfeS += nfel;

  return (0);
}